

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::WireFormat::MessageSetParser::ParseMessageSet
          (MessageSetParser *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  uint32_t uVar2;
  DescriptorPool *this_00;
  pointer pMVar3;
  pointer pMVar4;
  long lVar5;
  bool bVar6;
  ExtensionRange *pEVar7;
  FieldDescriptor *pFVar8;
  ulong uVar9;
  Reflection *this_01;
  uint uVar10;
  Message *message;
  byte *pbVar11;
  vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *this_02;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  pair<const_char_*,_unsigned_int> pVar15;
  MapIterator MStack_128;
  MapIterator MStack_d0;
  ParseContext *pPStack_78;
  vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *pvStack_70;
  ulong uStack_68;
  MessageSetParser *pMStack_60;
  ulong uStack_58;
  ulong uStack_50;
  byte *local_48 [3];
  
  local_48[0] = (byte *)ptr;
  do {
    uStack_50 = 0x32b3ac;
    bVar6 = EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)local_48,ctx->group_depth_);
    if (bVar6) {
      return (char *)local_48[0];
    }
    bVar1 = *local_48[0];
    uVar12 = (uint)bVar1;
    pbVar11 = local_48[0] + 1;
    if ((char)bVar1 < '\0') {
      uVar12 = ((uint)bVar1 + (uint)*pbVar11 * 0x80) - 0x80;
      if ((char)*pbVar11 < '\0') {
        uStack_50 = 0x32b4b1;
        pVar15 = ReadTagFallback((char *)local_48[0],uVar12);
        pbVar11 = (byte *)pVar15.first;
        if (pbVar11 == (byte *)0x0) {
          return (char *)0x0;
        }
        uVar12 = pVar15.second;
      }
      else {
        pbVar11 = local_48[0] + 2;
      }
    }
    if ((uVar12 == 0) || (pFVar8 = (FieldDescriptor *)(ulong)(uVar12 & 7), (uVar12 & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar12 - 1;
      return (char *)pbVar11;
    }
    local_48[0] = pbVar11;
    if (uVar12 == 0xb) {
      uVar12 = ctx->depth_;
      uVar10 = uVar12 - 1;
      ctx->depth_ = uVar10;
      if ((int)uVar12 < 1) {
        return (char *)0x0;
      }
      uVar14 = ctx->group_depth_;
      uVar13 = uVar14 + 1;
      ctx->group_depth_ = uVar13;
      uStack_50 = 0x32b433;
      pbVar11 = (byte *)ParseElement(this,(char *)pbVar11,ctx);
      if (pbVar11 == (byte *)0x0) {
        uVar14 = ctx->group_depth_ - 1;
        uVar12 = ctx->depth_ + 1;
      }
      else {
        message = (Message *)(ulong)(uint)ctx->depth_;
        if (uVar10 != ctx->depth_) {
          uStack_50 = 0x32b51e;
          ParseMessageSet();
LAB_0032b51e:
          uStack_50 = 0x32b52b;
          this_02 = (vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)
                    (ulong)uVar13;
          ParseMessageSet();
          (this_02->
          super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>).
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (this_02->
          super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>).
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (this_02->
          super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pPStack_78 = ctx;
          pvStack_70 = (vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                        *)(ulong)uVar13;
          uStack_68 = (ulong)uVar12;
          pMStack_60 = this;
          uStack_58 = (ulong)uVar14;
          uStack_50 = (ulong)uVar10;
          Reflection::MapBegin(&MStack_128,this_01,message,pFVar8);
          while( true ) {
            Reflection::MapEnd(&MStack_d0,this_01,message,pFVar8);
            bVar6 = MapFieldBase::EqualIterator(MStack_128.map_,&MStack_128,&MStack_d0);
            if ((MStack_d0.key_.type_ == CPPTYPE_STRING) &&
               (MStack_d0.key_.val_._0_8_ != (undefined1 *)((long)&MStack_d0.key_.val_ + 0x10))) {
              operator_delete((void *)MStack_d0.key_.val_.int64_value,MStack_d0.key_.val_._16_8_ + 1
                             );
            }
            if (bVar6) break;
            std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::
            push_back(this_02,&MStack_128.key_);
            MapFieldBase::IncreaseIterator(MStack_128.map_,&MStack_128);
          }
          if ((MStack_128.key_.type_ == CPPTYPE_STRING) &&
             (MStack_128.key_.val_._0_8_ != (undefined1 *)((long)&MStack_128.key_.val_ + 0x10))) {
            operator_delete((void *)MStack_128.key_.val_.int64_value,MStack_128.key_.val_._16_8_ + 1
                           );
          }
          pMVar3 = (this_02->
                   super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pMVar4 = (this_02->
                   super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (pMVar3 != pMVar4) {
            uVar9 = ((long)pMVar4 - (long)pMVar3 >> 3) * -0x3333333333333333;
            lVar5 = 0x3f;
            if (uVar9 != 0) {
              for (; uVar9 >> lVar5 == 0; lVar5 = lVar5 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::MapKey*,std::vector<google::protobuf::MapKey,std::allocator<google::protobuf::MapKey>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::MapKeySorter::MapKeyComparator>>
                      (pMVar3,pMVar4,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::MapKey*,std::vector<google::protobuf::MapKey,std::allocator<google::protobuf::MapKey>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::MapKeySorter::MapKeyComparator>>
                      (pMVar3,pMVar4);
          }
          return (char *)this_02;
        }
        message = (Message *)(ulong)(uint)ctx->group_depth_;
        if (uVar13 != ctx->group_depth_) goto LAB_0032b51e;
      }
      ctx->group_depth_ = uVar14;
      ctx->depth_ = uVar12;
      uVar2 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
      if (uVar2 != 0xb) {
        return (char *)0x0;
      }
    }
    else {
      uVar10 = uVar12 >> 3;
      uStack_50 = 0x32b461;
      pEVar7 = Descriptor::FindExtensionRangeContainingNumber(this->descriptor,uVar10);
      if (pEVar7 == (ExtensionRange *)0x0) {
        pFVar8 = (FieldDescriptor *)0x0;
      }
      else {
        this_00 = (ctx->data_).pool;
        if (this_00 == (DescriptorPool *)0x0) {
          uStack_50 = 0x32b4cd;
          pFVar8 = Reflection::FindKnownExtensionByNumber(this->reflection,uVar10);
        }
        else {
          uStack_50 = 0x32b47a;
          pFVar8 = DescriptorPool::FindExtensionByNumber(this_00,this->descriptor,uVar10);
        }
      }
      uStack_50 = 0x32b4e6;
      pbVar11 = (byte *)_InternalParseAndMergeField
                                  (this->msg,(char *)local_48[0],ctx,(ulong)uVar12,this->reflection,
                                   pFVar8);
    }
    local_48[0] = pbVar11;
    if (pbVar11 == (byte *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* ParseMessageSet(const char* ptr, internal::ParseContext* ctx) {
    while (!ctx->Done(&ptr)) {
      uint32_t tag;
      ptr = ReadTag(ptr, &tag);
      if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
      if (tag == 0 || (tag & 7) == WireFormatLite::WIRETYPE_END_GROUP) {
        ctx->SetLastTag(tag);
        break;
      }
      if (tag == WireFormatLite::kMessageSetItemStartTag) {
        // A message set item starts
        ptr = ctx->ParseGroupInlined(
            ptr, tag, [&](const char* ptr) { return ParseElement(ptr, ctx); });
      } else {
        // Parse other fields as normal extensions.
        int field_number = WireFormatLite::GetTagFieldNumber(tag);
        const FieldDescriptor* field = nullptr;
        if (descriptor->IsExtensionNumber(field_number)) {
          if (ctx->data().pool == nullptr) {
            field = reflection->FindKnownExtensionByNumber(field_number);
          } else {
            field = ctx->data().pool->FindExtensionByNumber(descriptor,
                                                            field_number);
          }
        }
        ptr = WireFormat::_InternalParseAndMergeField(msg, ptr, ctx, tag,
                                                      reflection, field);
      }
      if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
    }
    return ptr;
  }